

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign96.c
# Opt level: O0

err_t bign96KeypairVal(bign_params *params,octet *privkey,octet *pubkey)

{
  size_t n_00;
  bool_t bVar1;
  int iVar2;
  long *plVar3;
  word *a;
  bign_params *in_RDX;
  void *in_RSI;
  bign96_deep_i in_RDI;
  void *stack;
  word *Q;
  word *d;
  ec_o *ec;
  void *state;
  size_t n;
  err_t code;
  size_t in_stack_ffffffffffffffa8;
  u64 *src;
  u64 *dest;
  err_t local_24;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  bVar1 = memIsValid(in_RDI,0x150);
  if (bVar1 == 0) {
    local_24 = 0x6d;
  }
  else if (*(long *)in_RDI == 0x60) {
    bign96Start_keep(in_RDI);
    plVar3 = (long *)blobCreate(in_stack_ffffffffffffffa8);
    if (plVar3 == (long *)0x0) {
      local_24 = 0x6e;
    }
    else {
      local_24 = bign96Start(in_RSI,in_RDX);
      if (local_24 == 0) {
        n_00 = *(size_t *)(plVar3[3] + 0x30);
        bVar1 = memIsValid(in_RSI,0x18);
        if ((bVar1 == 0) || (bVar1 = memIsValid(in_RDX,0x30), bVar1 == 0)) {
          blobClose((blob_t)0x149bb9);
          local_24 = 0x6d;
        }
        else {
          a = (word *)((long)plVar3 + *plVar3);
          dest = a + n_00;
          src = dest + n_00 * 2;
          u64From(dest,src,0x149c1a);
          u64From(dest,src,0x149c35);
          bVar1 = wwIsZero(a,n_00);
          if ((bVar1 == 0) && (iVar2 = wwCmp(a,dest,n_00), iVar2 < 0)) {
            bVar1 = ecMulA((word *)ec,d,(ec_o *)Q,(word *)stack,
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
            if (bVar1 == 0) {
              local_24 = 0x1f6;
            }
            else {
              u64To(dest,(size_t)src,(u64 *)0x149cb5);
              bVar1 = memEq(dest,in_RDX,0x30);
              if (bVar1 == 0) {
                local_24 = 0x1f9;
              }
            }
            blobClose((blob_t)0x149cea);
          }
          else {
            blobClose((blob_t)0x149c6c);
            local_24 = 0x1f8;
          }
        }
      }
      else {
        blobClose((blob_t)0x149b5e);
      }
    }
  }
  else {
    local_24 = 0x1f6;
  }
  return local_24;
}

Assistant:

err_t bign96KeypairVal(const bign_params* params, const octet privkey[24],
	const octet pubkey[48])
{
	err_t code;
	size_t n;
	// состояние
	void* state;
	ec_o* ec;				/* описание эллиптической кривой */
	word* d;				/* [n] личный ключ */
	word* Q;				/* [2n] открытый ключ */
	void* stack;
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (params->l != 96)
		return ERR_BAD_PARAMS;
	// создать состояние
	state = blobCreate(bign96Start_keep(bign96KeypairVal_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bign96Start(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	n = ec->f->n;
	// проверить входные указатели
	if (!memIsValid(privkey, 24) || !memIsValid(pubkey, 48))
	{
		blobClose(state);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	d = objEnd(ec, word);
	Q = d + n;
	stack = Q + 2 * n;
	// d <- privkey
	wwFrom(d, privkey, 24);
	// 0 < d < q?
	wwFrom(Q, params->q, 24);
	if (wwIsZero(d, n) || wwCmp(d, Q, n) >= 0)
	{
		blobClose(state);
		return ERR_BAD_PRIVKEY;
	}
	// Q <- d G
	if (ecMulA(Q, ec->base, ec, d, n, stack))
	{
		// Q == pubkey?
		wwTo(Q, 48, Q);
		if (!memEq(Q, pubkey, 48))
			code = ERR_BAD_PUBKEY;
	}
	else
		code = ERR_BAD_PARAMS;
	// завершение
	blobClose(state);
	return code;
}